

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moduleexecutors.cpp
# Opt level: O1

bool __thiscall
trun::TestModuleExecutorSequential::Execute
          (TestModuleExecutorSequential *this,Ref *library,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
          *testModules)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer psVar6;
  pointer psVar7;
  undefined8 uVar8;
  TestModuleExecutorSequential *pTVar9;
  __node_base _Var10;
  TestModuleExecutorSequential *pTVar11;
  bool bVar12;
  kRunResultAction kVar13;
  int iVar14;
  ILogger *pIVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  Config *pCVar18;
  pointer pAVar19;
  _Rb_tree_header *p_Var20;
  value_type *__x;
  int iVar21;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  __it;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  _Var22;
  long lVar23;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  __first;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  __i;
  long lVar24;
  shared_ptr<trun::TestModule> *psVar25;
  Ref result;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  testModulesList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argModuleName;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  matches;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  __node_base local_e0;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined8 local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Ref local_68;
  Ref local_58;
  TestModuleExecutorSequential *local_48;
  pointer local_40;
  pointer local_38;
  
  local_100._0_8_ = &local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"TestModExeSeq","");
  pIVar15 = gnilk::Logger::GetLogger((string *)local_100);
  *(ILogger **)&this->field_0x8 = pIVar15;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ != &local_f0) {
    operator_delete((void *)local_100._0_8_,local_f0._M_allocated_capacity + 1);
  }
  local_d8.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (shared_ptr<trun::TestModule> *)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (shared_ptr<trun::TestModule> *)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var16 = (testModules->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var20 = &(testModules->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var16 != p_Var20) {
    do {
      std::
      vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ::push_back(&local_d8,(value_type *)(p_Var16 + 2));
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    } while ((_Rb_tree_header *)p_Var16 != p_Var20);
  }
  psVar7 = local_d8.
           super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar6 = local_d8.
           super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_d8.
      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar24 = (long)local_d8.
                   super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_d8.
                   super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = lVar24 >> 4;
    lVar23 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
              (local_d8.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_d8.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar24 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                (psVar6,psVar7);
    }
    else {
      psVar25 = psVar6 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                (psVar6,psVar25);
      for (; psVar25 != psVar7; psVar25 = psVar25 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Val_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                  (psVar25);
      }
    }
  }
  pCVar18 = Config::Instance();
  pAVar19 = (pointer)(pCVar18->modules).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (pointer)(pCVar18->modules).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  _Var10._M_nxt = (_Hash_node_base *)library;
  pTVar11 = this;
  if (pAVar19 != local_40) {
    do {
      local_48 = pTVar11;
      local_e0._M_nxt = _Var10._M_nxt;
      local_c0._M_allocated_capacity = (size_type)&local_b0;
      local_38 = pAVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,*(long *)pAVar19,
                 (pAVar19->file)._M_dataplus._M_p + *(long *)pAVar19);
      psVar6 = local_d8.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_88._M_allocated_capacity = 0;
      local_88._8_8_ = (long *)0x0;
      local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar4 = local_88._M_allocated_capacity;
      uVar5 = local_88._8_8_;
      pTVar11 = local_48;
      if (local_d8.
          super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_d8.
          super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
joined_r0x0011f3a8:
        for (; pTVar9 = local_48, uVar8 = local_88._8_8_, bVar12 = uVar4 != local_88._8_8_,
            local_88._8_8_ = uVar5, bVar12; uVar4 = (long *)(uVar4 + 0x10)) {
          iVar21 = 7;
          if (*(int *)(*(long *)uVar4 + 8) == 0) {
            puVar1 = &local_48->field_0x8;
            local_48 = pTVar11;
            gnilk::Log::Info<char_const*,char_const*>
                      (*(Log **)puVar1,"Executing tests for library: %s",
                       *(char **)(*(long *)uVar4 + 0x48));
            local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)uVar4;
            local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(uVar4 + 8);
            if (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            TestRunner::SetCurrentTestModule(&local_68);
            if (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            TestModule::Execute((TestModule *)local_100,*(Ref **)uVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
LAB_0011f44d:
              local_58.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_58.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              TestRunner::SetCurrentTestModule(&local_58);
              iVar21 = 0;
              if (local_58.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_58.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
            }
            else {
              kVar13 = TestResult::CheckIfContinue((TestResult *)local_100._0_8_);
              iVar21 = 6;
              if (kVar13 != kAbortAll) goto LAB_0011f44d;
            }
            pTVar11 = local_48;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
              pTVar11 = local_48;
            }
          }
          local_48 = pTVar11;
          pTVar11 = local_48;
          if ((iVar21 != 7) && (iVar21 != 0)) break;
          uVar5 = local_88._8_8_;
          local_48 = pTVar9;
          local_88._8_8_ = uVar8;
        }
      }
      else {
        iVar21 = 0;
        __x = local_d8.
              super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0,"-");
          if (iVar14 == 0) {
            iVar14 = 3;
            std::
            vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
            ::push_back((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                         *)&local_88,__x);
          }
          else {
            if (*(char *)local_c0._M_allocated_capacity == '!') {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                     1,0xffffffffffffffff);
              bVar12 = match(&((__x->
                               super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->name,(string *)local_100);
              iVar14 = 0;
              if (bVar12) {
                std::
                vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                ::push_back((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                             *)&local_88,__x);
                iVar21 = 2;
                iVar14 = 4;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._0_8_ != &local_f0) {
                operator_delete((void *)local_100._0_8_,local_f0._M_allocated_capacity + 1);
              }
            }
            else {
              bVar12 = match(&((__x->
                               super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->name,(string *)&local_c0);
              iVar14 = 0;
              if (bVar12) {
                std::
                vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                ::push_back((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                             *)&local_88,__x);
                iVar21 = 1;
                iVar14 = 4;
              }
            }
            if (bVar12 == false) {
              iVar14 = 0;
            }
          }
          psVar7 = local_d8.
                   super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (((iVar14 == 3) || (iVar14 == 0)) && (__x = __x + 1, __x != psVar6));
        uVar4 = local_88._M_allocated_capacity;
        uVar5 = local_88._8_8_;
        pTVar11 = local_48;
        if (iVar21 != 2) goto joined_r0x0011f3a8;
        if (local_88._8_8_ - local_88._0_8_ != 0x10) {
          __assert_fail("matches.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/moduleexecutors.cpp"
                        ,0x86,
                        "virtual bool trun::TestModuleExecutorSequential::Execute(const IDynLibrary::Ref &, const std::map<std::string, TestModule::Ref> &)"
                       );
        }
        local_100._0_8_ = *(undefined8 *)local_88._M_allocated_capacity;
        local_100._8_8_ = *(long *)(local_88._M_allocated_capacity + 8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1
            ;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count +
                   1;
            }
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1
            ;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1
            ;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1
            ;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count +
                   1;
            }
          }
        }
        lVar23 = (long)local_d8.
                       super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d8.
                       super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6;
        _Var22._M_current =
             local_d8.
             super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_a0 = local_100._8_8_;
        local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_100._0_8_;
        local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
        if (0 < lVar23) {
          _Var22._M_current =
               (shared_ptr<trun::TestModule> *)
               ((long)&((local_d8.
                         super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               ((long)local_d8.
                      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_d8.
                      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffc0U));
          lVar23 = lVar23 + 1;
          __it._M_current =
               local_d8.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          do {
            bVar12 = __gnu_cxx::__ops::
                     _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                     ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                   *)local_100,__it);
            __first._M_current = __it._M_current;
            if (bVar12) goto LAB_0011f66d;
            bVar12 = __gnu_cxx::__ops::
                     _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                     ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                   *)local_100,__it._M_current + 1);
            __first._M_current = __it._M_current + 1;
            if (bVar12) goto LAB_0011f66d;
            bVar12 = __gnu_cxx::__ops::
                     _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                     ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                   *)local_100,__it._M_current + 2);
            __first._M_current = __it._M_current + 2;
            if (bVar12) goto LAB_0011f66d;
            bVar12 = __gnu_cxx::__ops::
                     _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                     ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                   *)local_100,__it._M_current + 3);
            __first._M_current = __it._M_current + 3;
            if (bVar12) goto LAB_0011f66d;
            __it._M_current = __it._M_current + 4;
            lVar23 = lVar23 + -1;
          } while (1 < lVar23);
        }
        lVar23 = (long)psVar7 - (long)_Var22._M_current >> 4;
        if (lVar23 == 1) {
LAB_0011f654:
          bVar12 = __gnu_cxx::__ops::
                   _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                   ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                 *)local_100,_Var22);
          __first._M_current = _Var22._M_current;
          if (!bVar12) {
            __first._M_current = psVar7;
          }
        }
        else if (lVar23 == 2) {
LAB_0011f63c:
          bVar12 = __gnu_cxx::__ops::
                   _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                   ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                 *)local_100,_Var22);
          __first._M_current = _Var22._M_current;
          if (!bVar12) {
            _Var22._M_current = _Var22._M_current + 1;
            goto LAB_0011f654;
          }
        }
        else {
          __first._M_current = psVar7;
          if ((lVar23 == 3) &&
             (bVar12 = __gnu_cxx::__ops::
                       _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                       ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                     *)local_100,_Var22), __first._M_current = _Var22._M_current,
             !bVar12)) {
            _Var22._M_current = _Var22._M_current + 1;
            goto LAB_0011f63c;
          }
        }
LAB_0011f66d:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
        }
        _Var22._M_current = __first._M_current + 1;
        if (_Var22._M_current != psVar7 && __first._M_current != psVar7) {
          do {
            bVar12 = __gnu_cxx::__ops::
                     _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                     ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                   *)&local_98,_Var22);
            if (!bVar12) {
              peVar2 = ((_Var22._M_current)->
                       super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              p_Var3 = ((_Var22._M_current)->
                       super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                       ._M_pi;
              ((_Var22._M_current)->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = (element_type *)0x0;
              ((_Var22._M_current)->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this_00 = ((__first._M_current)->
                        super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi;
              ((__first._M_current)->
              super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
              ((__first._M_current)->
              super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
                   p_Var3;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              __first._M_current = __first._M_current + 1;
            }
            _Var22._M_current = _Var22._M_current + 1;
          } while (_Var22._M_current != psVar7);
        }
        if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
        }
        uVar4 = local_a0;
        std::
        vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
        ::_M_erase(&local_d8,(iterator)__first._M_current,
                   (iterator)
                   local_d8.
                   super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        pTVar11 = local_48;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
          pTVar11 = local_48;
        }
      }
      local_48 = pTVar11;
      std::
      vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ::~vector((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                 *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_allocated_capacity != &local_b0) {
        operator_delete((void *)local_c0._M_allocated_capacity,local_b0._M_allocated_capacity + 1);
      }
      pAVar19 = (pointer)((local_38->file).field_2._M_local_buf + 8);
      _Var10._M_nxt = local_e0._M_nxt;
      pTVar11 = local_48;
    } while (pAVar19 != local_40);
  }
  std::
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>::
  ~vector(&local_d8);
  return true;
}

Assistant:

bool TestModuleExecutorSequential::Execute(const IDynLibrary::Ref &library, const std::map<std::string, TestModule::Ref> &testModules) {
    bool bRes = true;
    pLogger = gnilk::Logger::GetLogger("TestModExeSeq");

    // Convert to vector and sort..
    std::vector<TestModule::Ref> testModulesList;
    for(auto &[k,v] : testModules) {
        testModulesList.push_back(v);
    }
    std::sort(testModulesList.begin(), testModulesList.end(), [](const TestModule::Ref &a, const TestModule::Ref &b) {
        return (a->name < b->name);
    });


    // For every argument on the command line
    for(auto argModuleName : Config::Instance().modules) {
        // Match cases
        std::vector<TestModule::Ref> matches;
        auto matchResult = ModuleMatch(matches, argModuleName, testModulesList);
        // In case this is negative (i.e. don't execute) we remove it from the sorted LOCAL list
        // NOTE: DO NOT change the state - if can be that another module depends on this one - in that case we need to execute...
        if (matchResult == kMatchResult::NegativeSingle) {
            assert(matches.size() == 1);
            auto tmToRemove = matches[0];
            // Remove this from the execution list...
            std::erase_if(testModulesList,[tmToRemove](const TestModule::Ref &m)->bool{
               return (tmToRemove->name == m->name);
            });
            continue;
        }

        // If here, we should execute anything in the matches list...
        for(auto &testModule : matches) {
            // Already executed?
            if (!testModule->IsIdle()) {
                //pLogger->Debug("Tests for '%s' already executed, skipping",testModule->name.c_str());
                continue;
            }

            pLogger->Info("Executing tests for library: %s", testModule->name.c_str());

            TestRunner::SetCurrentTestModule(testModule);
            auto result = testModule->Execute(library);
            if ((result != nullptr) && (result->CheckIfContinue() == TestResult::kRunResultAction::kAbortAll)) {
                break;
            }
            TestRunner::SetCurrentTestModule(nullptr);
        } // for modules

    }

    return bRes;
}